

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem_pool.cpp
# Opt level: O1

void * mpp_mem_pool_get_f(char *caller,MppMemPool pool)

{
  long lVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  
  pthread_mutex_lock((pthread_mutex_t *)((long)pool + 0x18));
  if (((byte)mpp_mem_pool_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_mem_pool","pool %d get used:unused [%d:%d] from %s",(char *)0x0,
               *(undefined8 *)((long)pool + 0x10),(ulong)*(uint *)((long)pool + 0x70),
               (ulong)*(uint *)((long)pool + 0x74),caller);
  }
  plVar4 = *(long **)((long)pool + 0x60);
  if (plVar4 == (long *)((long)pool + 0x60)) {
    plVar3 = (long *)mpp_osal_malloc("mpp_mem_pool_get_f",*(long *)((long)pool + 0x10) + 0x28);
    if (plVar3 == (long *)0x0) {
      plVar3 = (long *)0x0;
      _mpp_log_l(2,"mpp_mem_pool","failed to create node from size %d pool\n","mpp_mem_pool_get_f",
                 *(undefined8 *)((long)pool + 0x10));
      plVar5 = (long *)0x0;
    }
    else {
      *plVar3 = (long)plVar3;
      plVar5 = plVar3 + 5;
      plVar3[3] = (long)plVar5;
      plVar3[4] = *(long *)((long)pool + 0x10);
      plVar4 = plVar3 + 1;
      plVar3[1] = (long)plVar4;
      plVar3[2] = (long)plVar4;
      puVar2 = *(undefined8 **)((long)pool + 0x58);
      *(long **)((long)pool + 0x58) = plVar4;
      plVar3[1] = (long)pool + 0x50;
      plVar3[2] = (long)puVar2;
      *puVar2 = plVar4;
      *(int *)((long)pool + 0x70) = *(int *)((long)pool + 0x70) + 1;
    }
  }
  else {
    lVar1 = *plVar4;
    plVar3 = (long *)plVar4[1];
    *(long **)(lVar1 + 8) = plVar3;
    *plVar3 = lVar1;
    *plVar4 = (long)plVar4;
    plVar4[1] = (long)plVar4;
    puVar2 = *(undefined8 **)((long)pool + 0x58);
    *(long **)((long)pool + 0x58) = plVar4;
    *plVar4 = (long)pool + 0x50;
    plVar4[1] = (long)puVar2;
    *puVar2 = plVar4;
    *(int *)((long)pool + 0x74) = *(int *)((long)pool + 0x74) + -1;
    *(int *)((long)pool + 0x70) = *(int *)((long)pool + 0x70) + 1;
    plVar3 = plVar4 + -1;
    plVar5 = (long *)plVar4[2];
    plVar4[-1] = (long)plVar3;
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)pool + 0x18));
  if (plVar3 != (long *)0x0) {
    memset((void *)plVar3[3],0,plVar3[4]);
  }
  return plVar5;
}

Assistant:

void *mpp_mem_pool_get_f(const char *caller, MppMemPool pool)
{
    MppMemPoolImpl *impl = (MppMemPoolImpl *)pool;
    MppMemPoolNode *node = NULL;
    void* ptr = NULL;

    pthread_mutex_lock(&impl->lock);

    mem_pool_dbg_flow("pool %d get used:unused [%d:%d] from %s", impl->size,
                      impl->used_count, impl->unused_count, caller);

    if (!list_empty(&impl->unused)) {
        node = list_first_entry(&impl->unused, MppMemPoolNode, list);
        if (node) {
            list_del_init(&node->list);
            list_add_tail(&node->list, &impl->used);
            impl->unused_count--;
            impl->used_count++;
            ptr = node->ptr;
            node->check = node;
            goto DONE;
        }
    }

    node = mpp_malloc_size(MppMemPoolNode, sizeof(MppMemPoolNode) + impl->size);
    if (NULL == node) {
        mpp_err_f("failed to create node from size %d pool\n", impl->size);
        goto DONE;
    }

    node->check = node;
    node->ptr = (void *)(node + 1);
    node->size = impl->size;
    INIT_LIST_HEAD(&node->list);
    list_add_tail(&node->list, &impl->used);
    impl->used_count++;
    ptr = node->ptr;

DONE:
    pthread_mutex_unlock(&impl->lock);
    if (node)
        memset(node->ptr, 0 , node->size);
    return ptr;
}